

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_compileoption_used(char *zOptName)

{
  char *zRight;
  uint N;
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *__s;
  uchar uVar4;
  uchar uVar5;
  
  if (zOptName == (char *)0x0) {
    __s = (char *)0x0;
    N = 0;
  }
  else {
    lVar3 = 0;
    do {
      if ((ulong)(byte)zOptName[lVar3] == 0) {
        uVar5 = ""[(byte)"SQLITE_"[lVar3]];
        uVar4 = '\0';
LAB_00141bbb:
        lVar3 = 7;
        if (uVar4 != uVar5) {
          lVar3 = 0;
        }
        goto LAB_00141bcc;
      }
      uVar4 = ""[(byte)zOptName[lVar3]];
      uVar5 = ""[(byte)"SQLITE_"[lVar3]];
      if (uVar4 != uVar5) goto LAB_00141bbb;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
    lVar3 = 7;
LAB_00141bcc:
    __s = zOptName + lVar3;
    sVar2 = strlen(__s);
    N = (uint)sVar2 & 0x3fffffff;
  }
  lVar3 = 0;
  while( true ) {
    zRight = *(char **)((long)sqlite3azCompileOpt + lVar3);
    iVar1 = sqlite3_strnicmp(__s,zRight,N);
    if ((iVar1 == 0) && ((""[(byte)zRight[N]] & 0x46) == 0)) break;
    lVar3 = lVar3 + 8;
    if (lVar3 == 0x40) {
      return 0;
    }
  }
  return 1;
}

Assistant:

SQLITE_API int sqlite3_compileoption_used(const char *zOptName){
  int i, n;
  int nOpt;
  const char **azCompileOpt;
 
#if SQLITE_ENABLE_API_ARMOR
  if( zOptName==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  azCompileOpt = sqlite3CompileOptions(&nOpt);

  if( sqlite3StrNICmp(zOptName, "SQLITE_", 7)==0 ) zOptName += 7;
  n = sqlite3Strlen30(zOptName);

  /* Since nOpt is normally in single digits, a linear search is 
  ** adequate. No need for a binary search. */
  for(i=0; i<nOpt; i++){
    if( sqlite3StrNICmp(zOptName, azCompileOpt[i], n)==0
     && sqlite3IsIdChar((unsigned char)azCompileOpt[i][n])==0
    ){
      return 1;
    }
  }
  return 0;
}